

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O0

void generate_plus(chunk_conflict *c,wchar_t y1,wchar_t x1,wchar_t y2,wchar_t x2,wchar_t feat,
                  wchar_t flag)

{
  wchar_t y1_00;
  wchar_t x1_00;
  loc_conflict lVar1;
  wchar_t x0;
  wchar_t y0;
  wchar_t x;
  wchar_t y;
  wchar_t feat_local;
  wchar_t x2_local;
  wchar_t y2_local;
  wchar_t x1_local;
  wchar_t y1_local;
  chunk_conflict *c_local;
  
  y1_00 = (y1 + y2) / 2;
  x1_00 = (x1 + x2) / 2;
  y0 = y1;
  if (c == (chunk_conflict *)0x0) {
    __assert_fail("c",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-room.c"
                  ,0x183,"void generate_plus(struct chunk *, int, int, int, int, int, int)");
  }
  for (; y0 <= y2; y0 = y0 + L'\x01') {
    lVar1 = (loc_conflict)loc(x1_00,y0);
    square_set_feat((chunk *)c,lVar1,feat);
  }
  x0 = x1;
  if (flag != L'\0') {
    generate_mark(c,y1,x1_00,y2,x1_00,flag);
  }
  for (; x0 <= x2; x0 = x0 + L'\x01') {
    lVar1 = (loc_conflict)loc(x0,y1_00);
    square_set_feat((chunk *)c,lVar1,feat);
  }
  if (flag != L'\0') {
    generate_mark(c,y1_00,x1,y1_00,x2,flag);
  }
  return;
}

Assistant:

static void generate_plus(struct chunk *c, int y1, int x1, int y2, int x2, 
						  int feat, int flag)
{
	int y, x;

	/* Find the center */
	int y0 = (y1 + y2) / 2;
	int x0 = (x1 + x2) / 2;

	assert(c);

	for (y = y1; y <= y2; y++) square_set_feat(c, loc(x0, y), feat);
	if (flag) generate_mark(c, y1, x0, y2, x0, flag);
	for (x = x1; x <= x2; x++) square_set_feat(c, loc(x, y0), feat);
	if (flag) generate_mark(c, y0, x1, y0, x2, flag);
}